

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O3

void __thiscall
TileWire::_checkForInvalidState
          (TileWire *this,State targetState,State *state,FollowWireStage *stage)

{
  TileWire *pTVar1;
  pointer ppVar2;
  pair<TileWire_*,_Direction> *wire;
  pointer ppVar3;
  
  if (*stage == INITIAL_STAGE) {
    if (targetState != MIDDLE) {
      *stage = INPUT_FOUND;
    }
    if (*state != targetState) {
      *state = targetState;
      ppVar2 = traversedWires.
               super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar3 = traversedWires.
                    super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar2; ppVar3 = ppVar3 + 1
          ) {
        pTVar1 = ppVar3->first;
        if ((pTVar1->_type == CROSSOVER) && ((ppVar3->second & 0x80000001) == EAST)) {
          pTVar1->_state2 = targetState;
        }
        else {
          pTVar1->_state1 = targetState;
        }
      }
    }
  }
  else if ((targetState != MIDDLE) && (*state != targetState)) {
    *stage = INVALID_STAGE;
    return;
  }
  return;
}

Assistant:

void TileWire::_checkForInvalidState(State targetState, State& state, FollowWireStage& stage) const {
    if (stage == INITIAL_STAGE) {
        if (targetState != MIDDLE) {
            stage = INPUT_FOUND;
        }
        if (state != targetState) {
            state = targetState;
            _fixTraversedWires(state);
        }
    } else if (targetState != MIDDLE && state != targetState) {
        stage = INVALID_STAGE;
    }
}